

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O0

lest * __thiscall lest::make_string<S,void()>(lest *this,offset_in_S_to_subr ptr)

{
  void *pvVar1;
  ostream *poVar2;
  string local_1e0 [34];
  char local_1be;
  char local_1bd;
  int local_1bc;
  int local_1b8;
  ostringstream local_1a8 [8];
  ostringstream os;
  offset_in_S_to_subr ptr_local;
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  pvVar1 = (void *)std::ostream::operator<<(local_1a8,std::internal);
  pvVar1 = (void *)std::ostream::operator<<(pvVar1,std::hex);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar1,std::showbase);
  local_1bc = (int)std::setw(0x22);
  local_1b8 = local_1bc;
  poVar2 = std::operator<<(poVar2,(_Setw)local_1bc);
  local_1be = (char)std::setfill<char>('0');
  local_1bd = local_1be;
  poVar2 = std::operator<<(poVar2,local_1be);
  std::ostream::operator<<(poVar2,ptr != 0);
  std::__cxx11::ostringstream::str();
  std::__cxx11::string::string((string *)this,local_1e0);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return this;
}

Assistant:

inline std::string make_string( R C::* ptr )
{
    std::ostringstream os;
    os << std::internal << std::hex << std::showbase << std::setw( 2 + 2 * sizeof(R C::* ) ) << std::setfill('0') << ptr;
    return os.str();
}